

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy.c
# Opt level: O1

void ccopy_(integer *n,singlecomplex *cx,integer *incx,singlecomplex *cy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  
  uVar1 = *n;
  if (0 < (int)uVar1) {
    iVar2 = *incx;
    if (((long)iVar2 == 1) && (*incy == 1)) {
      uVar6 = 0;
      do {
        cy[uVar6].r = cx[uVar6].r;
        cy[uVar6].i = cx[uVar6].i;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    else {
      iVar3 = *incy;
      iVar4 = iVar3 * (1 - uVar1) + 1;
      if (-1 < (long)iVar3) {
        iVar4 = 1;
      }
      iVar5 = (1 - uVar1) * iVar2 + 1;
      if (-1 < iVar2) {
        iVar5 = 1;
      }
      uVar9 = 1;
      if (1 < (int)uVar1) {
        uVar9 = uVar1;
      }
      pfVar8 = &cx[(long)iVar5 + -1].i;
      pfVar7 = &cy[(long)iVar4 + -1].i;
      do {
        ((singlecomplex *)(pfVar7 + -1))->r = ((singlecomplex *)(pfVar8 + -1))->r;
        *pfVar7 = *pfVar8;
        pfVar8 = pfVar8 + (long)iVar2 * 2;
        pfVar7 = pfVar7 + (long)iVar3 * 2;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

void ccopy_(integer *n, singlecomplex *cx, integer *incx, singlecomplex *
	cy, integer *incy)
{


    /* System generated locals */


    /* Local variables */
    integer i, ix, iy;


/*     copies a vector, x, to a vector, y.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	CY(iy).r = CX(ix).r, CY(iy).i = CX(ix).i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	CY(i).r = CX(i).r, CY(i).i = CX(i).i;
/* L30: */
    }
    return;
}